

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> * __thiscall
tinyusdz::lerp<std::array<double,2ul>>
          (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *a,
          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *b,double t)

{
  double dVar1;
  double dVar2;
  pointer paVar3;
  pointer paVar4;
  ulong uVar5;
  long lVar6;
  ulong __new_size;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = *(long *)(this + 8) - *(long *)this >> 4;
  __new_size = (long)(a->
                     super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4;
  if (uVar5 <= __new_size) {
    __new_size = uVar5;
  }
  if (__new_size != 0) {
    ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      lVar6 = 8;
      do {
        paVar3 = (a->
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dVar1 = *(double *)(*(long *)this + lVar6);
        dVar2 = *(double *)((long)paVar3->_M_elems + lVar6);
        paVar4 = (__return_storage_ptr__->
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)paVar4->_M_elems + lVar6 + -8) =
             *(double *)((long)paVar3->_M_elems + lVar6 + -8) * t +
             *(double *)(*(long *)this + -8 + lVar6) * (1.0 - t);
        *(double *)((long)paVar4->_M_elems + lVar6) = dVar2 * t + dVar1 * (1.0 - t);
        lVar6 = lVar6 + 0x10;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}